

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

str_attr_accessor * __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>::attr
          (str_attr_accessor *__return_storage_ptr__,
          object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
          *this,char *key)

{
  handle local_30;
  PyObject *local_28;
  char *local_20;
  char *key_local;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_> *this_local
  ;
  
  local_20 = key;
  key_local = (char *)this;
  this_local = (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
                *)__return_storage_ptr__;
  derived(this);
  accessor::operator_cast_to_object((accessor *)&local_30);
  local_28 = local_30.m_ptr;
  accessor<pybind11::detail::accessor_policies::str_attr>::accessor
            (__return_storage_ptr__,local_30,local_20);
  object::~object((object *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

str_attr_accessor object_api<D>::attr(const char *key) const {
    return {derived(), key};
}